

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TubeResonator.cpp
# Opt level: O0

int TubeResonator::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  ulong uVar1;
  UnityAudioParameterDefinition *pUVar2;
  char *pcVar3;
  char *pcVar4;
  int local_18;
  int n;
  int numparams;
  UnityAudioEffectDefinition *definition_local;
  
  uVar1 = SUB168(ZEXT816(0x18) * ZEXT816(0x40),0);
  if (SUB168(ZEXT816(0x18) * ZEXT816(0x40),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(uVar1);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"Num sections","",1.0,10.0,3.0,1.0,1.0,0,"Number of sections");
  RegisterParameter(definition,"Feedback","%",0.0,1.0,0.5,100.0,1.0,1,"Feedback");
  RegisterParameter(definition,"Nonlinearity","%",0.0,1.0,0.0,100.0,1.0,2,
                    "Amount of nonlinearity at reflection");
  RegisterParameter(definition,"Mike position","%",0.0,1.0,0.0,100.0,1.0,3,"Microphone position");
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    pcVar3 = tmpstr(0,"Length %d",(ulong)(local_18 + 1));
    pcVar4 = tmpstr(1,"Section %d length",(ulong)(local_18 + 1));
    RegisterParameter(definition,pcVar3,"cm",0.01,180.625,7.0,1.0,3.0,local_18 * 2 + 4,pcVar4);
    pcVar3 = tmpstr(0,"Radius %d",(ulong)(local_18 + 1));
    pcVar4 = tmpstr(1,"Section %d radius",(ulong)(local_18 + 1));
    RegisterParameter(definition,pcVar3,"cm",0.01,100.0,3.0,1.0,3.0,local_18 * 2 + 5,pcVar4);
  }
  return 0x18;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Num sections", "", 1.0f, MAXSECTIONS, 3.0f, 1.0f, 1.0f, P_NUMSECTIONS, "Number of sections");
        RegisterParameter(definition, "Feedback", "%", 0.0f, 1.0f, 0.5f, 100.0f, 1.0f, P_FB, "Feedback");
        RegisterParameter(definition, "Nonlinearity", "%", 0.0f, 1.0f, 0.0f, 100.0f, 1.0f, P_NL, "Amount of nonlinearity at reflection");
        RegisterParameter(definition, "Mike position", "%", 0.0f, 1.0f, 0.0f, 100.0f, 1.0f, P_MIKEPOS, "Microphone position");
        for (int n = 0; n < MAXSECTIONS; n++)
        {
            RegisterParameter(definition, tmpstr(0, "Length %d", n + 1), "cm", 0.01f, (float)Delay::MASK * (34000.0f / 48000.0f), 7.0f, 1.0f, 3.0f, P_L1 + n * 2, tmpstr(1, "Section %d length", n + 1));
            RegisterParameter(definition, tmpstr(0, "Radius %d", n + 1), "cm", 0.01f, 100.0f, 3.0f, 1.0f, 3.0f, P_A1 + n * 2, tmpstr(1, "Section %d radius", n + 1));
        }
        return numparams;
    }